

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void Assimp::Bitmap::WriteData(aiTexture *texture,IOStream *file)

{
  aiTexel *paVar1;
  aiTexel *texel;
  size_t j;
  size_t i;
  uint8_t pixel [4];
  uint padding;
  IOStream *file_local;
  aiTexture *texture_local;
  
  i._4_4_ = 0;
  _pixel = file;
  for (j = 0; j < texture->mHeight; j = j + 1) {
    for (texel = (aiTexel *)0x0; texel < (aiTexel *)(ulong)texture->mWidth;
        texel = (aiTexel *)&texel->g) {
      paVar1 = texture->pcData +
               (long)(&texel->b + ((texture->mHeight - j) + -1) * (ulong)texture->mWidth);
      i._0_1_ = paVar1->r;
      i._1_1_ = paVar1->g;
      i._2_1_ = paVar1->b;
      i._3_1_ = paVar1->a;
      (*_pixel->_vptr_IOStream[3])(_pixel,&i,4,1);
    }
    (*_pixel->_vptr_IOStream[3])(_pixel,"",(ulong)i._4_4_,1);
  }
  return;
}

Assistant:

void Bitmap::WriteData(aiTexture* texture, IOStream* file) {
        static const std::size_t padding_offset = 4;
        static const uint8_t padding_data[padding_offset] = {0x0, 0x0, 0x0, 0x0};

        unsigned int padding = (padding_offset - ((mBytesPerPixel * texture->mWidth) % padding_offset)) % padding_offset;
        uint8_t pixel[mBytesPerPixel];

        for(std::size_t i = 0; i < texture->mHeight; ++i) {
            for(std::size_t j = 0; j < texture->mWidth; ++j) {
                const aiTexel& texel = texture->pcData[(texture->mHeight - i - 1) * texture->mWidth + j]; // Bitmap files are stored in bottom-up format

                pixel[0] = texel.r;
                pixel[1] = texel.g;
                pixel[2] = texel.b;
                pixel[3] = texel.a;

                file->Write(pixel, mBytesPerPixel, 1);
            }

            file->Write(padding_data, padding, 1);
        }
    }